

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::Clear
          (VisionFeaturePrint_Objects *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->output_).super_RepeatedPtrFieldBase);
  this->version_ = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void VisionFeaturePrint_Objects::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  output_.Clear();
  version_ = 0;
  _internal_metadata_.Clear<std::string>();
}